

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMRangeImpl::selectNode(DOMRangeImpl *this,DOMNode *refNode)

{
  short *psVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMRangeException *this_00;
  XMLSize_t XVar5;
  undefined4 extraout_var_01;
  
  validateNode(this,refNode);
  if ((refNode == (DOMNode *)0x0) ||
     ((uVar2 = (*refNode->_vptr_DOMNode[4])(refNode), uVar2 < 0xd &&
      ((0x1a44U >> (uVar2 & 0x1f) & 1) != 0)))) {
    this_00 = (DOMRangeException *)__cxa_allocate_exception(0x28);
    DOMRangeException::DOMRangeException(this_00,0x70,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMRangeException::typeinfo,DOMRangeException::~DOMRangeException);
  }
  iVar3 = (*refNode->_vptr_DOMNode[4])(refNode);
  uVar2 = iVar3 * 0x10000 - 0x30000U >> 0x10;
  if ((uVar2 < 6) && ((0x33U >> (uVar2 & 0x1f) & 1) != 0)) {
    this->fStartContainer = refNode;
    this->fEndContainer = refNode;
    this->fStartOffset = 0;
    if (iVar3 * 0x10000 == 0x70000) {
      iVar3 = (*refNode->_vptr_DOMNode[0x29])();
      XVar5 = 0;
      if (CONCAT44(extraout_var,iVar3) != 0) {
        do {
          psVar1 = (short *)(CONCAT44(extraout_var,iVar3) + XVar5);
          XVar5 = XVar5 + 2;
        } while (*psVar1 != 0);
        XVar5 = ((long)XVar5 >> 1) - 1;
      }
    }
    else {
      iVar3 = (*refNode->_vptr_DOMNode[0x29])(refNode);
      XVar5 = CONCAT44(extraout_var_00,iVar3);
    }
  }
  else {
    iVar3 = (*refNode->_vptr_DOMNode[5])(refNode);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
    if (pDVar4 == (DOMNode *)0x0) {
      return;
    }
    this->fStartContainer = pDVar4;
    this->fEndContainer = pDVar4;
    iVar3 = (*pDVar4->_vptr_DOMNode[7])(pDVar4);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var_02,iVar3);
    XVar5 = 0;
    if (pDVar4 != refNode && pDVar4 != (DOMNode *)0x0) {
      do {
        XVar5 = XVar5 + 1;
        iVar3 = (*pDVar4->_vptr_DOMNode[10])(pDVar4);
        pDVar4 = (DOMNode *)CONCAT44(extraout_var_03,iVar3);
        if (pDVar4 == (DOMNode *)0x0) break;
      } while (pDVar4 != refNode);
    }
    this->fStartOffset = XVar5;
    XVar5 = XVar5 + 1;
  }
  this->fEndOffset = XVar5;
  return;
}

Assistant:

void DOMRangeImpl::selectNode(const DOMNode* refNode)
{
    validateNode(refNode);
    if ( !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }
    //First check for the text type node
    short type = refNode->getNodeType();
    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        //The node itself is the container.
        fStartContainer = (DOMNode*) refNode;
        fEndContainer   = (DOMNode*) refNode;

        //Select all the contents of the node
        fStartOffset = 0;
        if (type == DOMNode::PROCESSING_INSTRUCTION_NODE)
            fEndOffset = XMLString::stringLen(((DOMProcessingInstruction*)refNode)->getData());
        else
            fEndOffset = ((DOMText *)refNode)->getLength();
        return;
    }

    DOMNode* parent = refNode->getParentNode();
    if (parent != 0 ) // REVIST: what to do if it IS 0?
    {
        fStartContainer = parent;
        fEndContainer = parent;

        XMLSize_t i = 0;
        for (DOMNode* n = parent->getFirstChild(); n!=0 && n!=refNode; n = n->getNextSibling()) {
            i++;
        }

        fStartOffset = i;
        fEndOffset = fStartOffset+1;
    }
}